

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::RepeatedField<double>::erase
          (RepeatedField<double> *this,const_iterator first,const_iterator last)

{
  void *__dest;
  void *pvVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  
  pvVar1 = this->arena_or_elements_;
  if (first == last) {
    lVar3 = (long)(int)((ulong)((long)first - (long)pvVar1) >> 3);
  }
  else {
    iVar2 = this->current_size_;
    lVar3 = (long)(int)((ulong)((long)first - (long)pvVar1) >> 3);
    __dest = (void *)((long)pvVar1 + lVar3 * 8);
    __n = (long)pvVar1 + ((long)iVar2 * 8 - (long)last);
    if (__n != 0) {
      memmove(__dest,last,__n);
      iVar2 = this->current_size_;
      pvVar1 = this->arena_or_elements_;
    }
    if (0 < iVar2) {
      this->current_size_ = (int)((long)__dest + (__n - (long)pvVar1) >> 3);
    }
  }
  return (iterator)((long)pvVar1 + lVar3 * 8);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}